

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_case.h
# Opt level: O0

test_result * __thiscall
ut::test_case_impl<agge::tests::RendererParallelTests>::execute
          (test_result *__return_storage_ptr__,
          test_case_impl<agge::tests::RendererParallelTests> *this)

{
  setup_impl<agge::tests::RendererParallelTests> *psVar1;
  code *local_130;
  exception *e;
  exception *e_2;
  exception *e_1;
  RendererParallelTests local_43;
  RendererParallelTests local_40;
  RendererParallelTests f;
  string outcome;
  bool terminated;
  bool passed;
  bool initialized;
  test_case_impl<agge::tests::RendererParallelTests> *this_local;
  
  std::__cxx11::string::string((string *)&local_40);
  agge::tests::RendererParallelTests::RendererParallelTests(&local_43);
  psVar1 = shared_ptr<ut::setup_impl<agge::tests::RendererParallelTests>,_unsigned_int>::operator->
                     (&this->_setup);
  setup_impl<agge::tests::RendererParallelTests>::init(psVar1,(EVP_PKEY_CTX *)&local_43);
  local_130 = (code *)this->_method;
  if (((ulong)local_130 & 1) != 0) {
    local_130 = *(code **)(local_130 +
                          *(long *)(&local_43.field_0x0 + *(long *)&this->field_0x10) + -1);
  }
  (*local_130)(&local_43.field_0x0 + *(long *)&this->field_0x10);
  psVar1 = shared_ptr<ut::setup_impl<agge::tests::RendererParallelTests>,_unsigned_int>::operator->
                     (&this->_setup);
  setup_impl<agge::tests::RendererParallelTests>::teardown(psVar1,&local_43);
  test_result::test_result(__return_storage_ptr__,true,true,true,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

inline test_result test_case_impl<Fixture>::execute()
	{
		bool initialized = false;
		bool passed = false;
		bool terminated = false;
		std::string outcome;

		try
		{
			Fixture f;

			try
			{
				_setup->init(f);
				initialized = true;

				try
				{
					(f.*_method)();
					passed = true;
				}
				catch (const std::exception &e)
				{
					outcome = e.what();
				}
				catch (...)
				{
					outcome = "Test Failed!";
				}

				try
				{
					_setup->teardown(f);
					terminated = true;
				}
				catch (const std::exception &e)
				{
					outcome += outcome.empty() ? "" : "\n";
					outcome += std::string("Teardown Failed: ") + e.what();
				}
				catch (...)
				{
					outcome += outcome.empty() ? "" : "\n";
					outcome += "Teardown Failed!";
				}
			}
			catch (const std::exception &e)
			{
				outcome = std::string("Initialization Failed: ") + e.what();
			}
			catch (...)
			{
				outcome = "Initialization Failed!";
			}
		}
		catch (...)
		{
		}
		return test_result(initialized, passed, terminated, outcome);
	}